

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::ParseVariantSetFields
          (Impl *this,FieldValuePairVector *fvs,
          vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *variantChildren)

{
  pointer ppVar1;
  vtable_type *pvVar2;
  int iVar3;
  ostream *poVar4;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *__x;
  pointer ppVar5;
  ostringstream ss_w;
  string local_1d0;
  Impl *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  ppVar5 = (fvs->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (fvs->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != ppVar1) {
    local_1b0 = this;
    do {
      iVar3 = ::std::__cxx11::string::compare((char *)ppVar5);
      if (iVar3 == 0) {
        __x = tinyusdz::value::Value::
              as<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                        (&(ppVar5->second).value_,false);
        if (__x == (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)0x0) {
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[USDC]",6);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ParseVariantSetFields",0x15);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x904);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"`variantChildren` must be type `token[]`, but got type `"
                     ,0x38);
          pvVar2 = (ppVar5->second).value_.v_.vtable;
          if (pvVar2 == (vtable_type *)0x0) {
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            local_1d0.field_2._M_allocated_capacity._0_4_ = 0x64696f76;
            local_1d0._M_string_length = 4;
            local_1d0.field_2._M_allocated_capacity._4_4_ =
                 local_1d0.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
          }
          else {
            (*pvVar2->type_name)((string *)&local_1d0);
          }
          poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,
                              local_1d0._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"`",1);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,
                            CONCAT44(local_1d0.field_2._M_allocated_capacity._4_4_,
                                     local_1d0.field_2._M_allocated_capacity._0_4_) + 1);
          }
          ::std::__cxx11::stringbuf::str();
          PushError(local_1b0,&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,
                            CONCAT44(local_1d0.field_2._M_allocated_capacity._4_4_,
                                     local_1d0.field_2._M_allocated_capacity._0_4_) + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
          ::std::ios_base::~ios_base(local_138);
          return false;
        }
        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)variantChildren,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)__x);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[warn]",6);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ParseVariantSetFields",0x15);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x908);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"VariantSet field TODO: ",0x17);
        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(ppVar5->first)._M_dataplus._M_p,
                            (ppVar5->first)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushWarn(local_1b0,&local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,
                          CONCAT44(local_1d0.field_2._M_allocated_capacity._4_4_,
                                   local_1d0.field_2._M_allocated_capacity._0_4_) + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
        ::std::ios_base::~ios_base(local_138);
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar1);
  }
  return true;
}

Assistant:

bool USDCReader::Impl::ParseVariantSetFields(
    const crate::FieldValuePairVector &fvs,
    std::vector<value::token> &variantChildren) {
  // Fields for Prim and Prim metas.
  for (const auto &fv : fvs) {
    if (fv.first == "variantChildren") {
      if (auto pv = fv.second.as<std::vector<value::token>>()) {
        variantChildren = (*pv);
        DCOUT("variantChildren: " << variantChildren);
      } else {
        PUSH_ERROR_AND_RETURN_TAG(
            kTag, "`variantChildren` must be type `token[]`, but got type `"
                      << fv.second.type_name() << "`");
      }
    } else {
      DCOUT("VariantSet field TODO: " << fv.first);
      PUSH_WARN("VariantSet field TODO: " << fv.first);
    }
  }

  return true;
}